

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O2

RenderSampleAnalyzeResult
deqp::gles3::Performance::anon_unknown_1::
analyzeSampleResults<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
          (TestLog *log,
          vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
          *samples)

{
  pointer pRVar1;
  pointer pRVar2;
  float fVar3;
  float fVar4;
  ulong uVar5;
  SampleBuilder *pSVar6;
  ulong uVar7;
  offset_in_SampleType_to_deUint64 in_RCX;
  deUint64 *pdVar8;
  int *piVar9;
  string *psVar10;
  LogNumber<float> *pLVar11;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  void *__buf_07;
  void *__buf_08;
  void *__buf_09;
  void *__buf_10;
  void *__buf_11;
  void *__buf_12;
  void *__buf_13;
  void *__buf_14;
  void *__buf_15;
  void *__buf_16;
  void *__buf_17;
  void *__buf_18;
  void *__buf_19;
  void *__buf_20;
  void *__buf_21;
  void *__buf_22;
  void *__buf_23;
  void *__buf_24;
  void *__buf_25;
  void *__buf_26;
  void *__buf_27;
  void *__buf_28;
  void *__buf_29;
  void *__buf_30;
  void *__buf_31;
  void *__buf_32;
  void *__buf_33;
  void *__buf_34;
  void *__buf_35;
  void *__buf_36;
  long lVar12;
  long lVar13;
  int __fd;
  ulong uVar14;
  ulong in_R9;
  uint uVar15;
  uint uVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float xmin;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float xmax;
  float xmax_00;
  float fVar24;
  float fVar25;
  float fVar26;
  RenderSampleAnalyzeResult RVar27;
  allocator<char> local_b13;
  allocator<char> local_b12;
  allocator<char> local_b11;
  allocator<char> local_b10;
  allocator<char> local_b0f;
  allocator<char> local_b0e;
  allocator<char> local_b0d;
  allocator<char> local_b0c;
  allocator<char> local_b0b;
  allocator<char> local_b0a;
  allocator<char> local_b09;
  allocator<char> local_b08;
  allocator<char> local_b07;
  allocator<char> local_b06;
  allocator<char> local_b05;
  allocator<char> local_b04;
  allocator<char> local_b03;
  allocator<char> local_b02;
  allocator<char> local_b01;
  allocator<char> local_b00;
  allocator<char> local_aff;
  allocator<char> local_afe;
  allocator<char> local_afd;
  allocator<char> local_afc;
  allocator<char> local_afb;
  allocator<char> local_afa;
  allocator<char> local_af9;
  float local_af8;
  allocator<char> local_af1;
  allocator<char> local_af0;
  allocator<char> local_aef;
  allocator<char> local_aee;
  allocator<char> local_aed;
  allocator<char> local_aec;
  allocator<char> local_aeb;
  allocator<char> local_aea;
  allocator<char> local_ae9;
  LineParametersWithConfidence contributionFitting;
  vector<float,_std::allocator<float>_> processingRates;
  vector<unsigned_long,_std::allocator<unsigned_long>_> values;
  LineParametersWithConfidence theilSenFitting;
  ScopedLogSection section_2;
  string local_998;
  string local_978;
  string local_958;
  string local_938;
  string local_918;
  string local_8f8;
  string local_8d8;
  string local_8b8;
  string local_898;
  ScopedLogSection section_1;
  LogNumber<float> local_858;
  LogNumber<float> local_7f0;
  LogNumber<float> local_788;
  LogNumber<float> local_720;
  LogNumber<float> local_6b8;
  LogNumber<float> local_650;
  LogNumber<float> local_5e8;
  LogNumber<float> local_580;
  LogNumber<float> local_518;
  LogNumber<float> local_4b0;
  undefined1 local_448 [16];
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  ScopedLogSection section;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  StatsType resultStats;
  
  Performance::(anonymous_namespace)::
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>>
            (&theilSenFitting,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
              *)&DAT_00000030,in_RCX);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&values,((long)(samples->
                            super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(samples->
                           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                           )._M_impl.super__Vector_impl_data._M_start) / 0x48,
             (allocator_type *)&processingRates);
  pRVar1 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar5 = ((long)(samples->
                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pRVar1) / 0x48;
  uVar14 = 0;
  uVar7 = uVar5 & 0xffffffff;
  if ((int)uVar5 < 1) {
    uVar7 = uVar14;
  }
  pdVar8 = &(pRVar1->duration).fitResponseDuration;
  for (; uVar7 != uVar14; uVar14 = uVar14 + 1) {
    values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[uVar14] = *pdVar8;
    pdVar8 = pdVar8 + 9;
  }
  std::vector<float,_std::allocator<float>_>::vector
            (&processingRates,uVar5,(allocator_type *)&local_858);
  pRVar1 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar5 = ((long)(samples->
                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pRVar1) / 0x48;
  uVar14 = 0;
  uVar7 = uVar5 & 0xffffffff;
  if ((int)uVar5 < 1) {
    uVar7 = uVar14;
  }
  piVar9 = &pRVar1->renderDataSize;
  for (; uVar7 != uVar14; uVar14 = uVar14 + 1) {
    uVar5 = values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[uVar14];
    if ((long)uVar5 < 0) {
      in_R9 = uVar5 >> 1;
    }
    *(float *)(CONCAT44(processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start._4_4_,
                        processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start._0_4_) + uVar14 * 4) =
         (float)*piVar9 / (((float)uVar5 / 1000.0) / 1000.0);
    piVar9 = piVar9 + 0x12;
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (CONCAT44(processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start._4_4_,
                      processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start._0_4_),
             CONCAT44(processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_finish._4_4_,
                      processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_finish._0_4_));
  resultStats.medianRate =
       linearSample<float>((vector<float,_std::allocator<float>_> *)
                           &processingRates.super__Vector_base<float,_std::allocator<float>_>,0.5);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&processingRates.super__Vector_base<float,_std::allocator<float>_>);
  std::vector<float,_std::allocator<float>_>::vector
            (&processingRates,
             ((long)(samples->
                    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) / 0x48,(allocator_type *)&local_858);
  pRVar1 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar5 = ((long)(samples->
                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pRVar1) / 0x48;
  uVar14 = 0;
  uVar7 = uVar5 & 0xffffffff;
  if ((int)uVar5 < 1) {
    uVar7 = uVar14;
  }
  piVar9 = &pRVar1->renderDataSize;
  for (; uVar7 != uVar14; uVar14 = uVar14 + 1) {
    uVar5 = values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[uVar14];
    if ((long)uVar5 < 0) {
      in_R9 = uVar5 >> 1;
    }
    *(float *)(CONCAT44(processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start._4_4_,
                        processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start._0_4_) + uVar14 * 4) =
         (float)uVar5 - ((float)*piVar9 * theilSenFitting.coefficient + theilSenFitting.offset);
    piVar9 = piVar9 + 0x12;
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (CONCAT44(processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start._4_4_,
                      processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start._0_4_),
             CONCAT44(processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_finish._4_4_,
                      processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_finish._0_4_));
  resultStats.maxDiffTime =
       *(float *)(CONCAT44(processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl
                           .super__Vector_impl_data._M_finish._4_4_,
                           processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl
                           .super__Vector_impl_data._M_finish._0_4_) + -4);
  resultStats.maxDiff9DecileTime =
       linearSample<float>((vector<float,_std::allocator<float>_> *)
                           &processingRates.super__Vector_base<float,_std::allocator<float>_>,0.9);
  resultStats.medianDiffTime =
       linearSample<float>((vector<float,_std::allocator<float>_> *)
                           &processingRates.super__Vector_base<float,_std::allocator<float>_>,0.5);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&processingRates.super__Vector_base<float,_std::allocator<float>_>);
  std::vector<float,_std::allocator<float>_>::vector
            (&processingRates,
             ((long)(samples->
                    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) / 0x48,(allocator_type *)&local_858);
  pRVar1 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar5 = ((long)(samples->
                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pRVar1) / 0x48;
  uVar14 = 0;
  uVar7 = uVar5 & 0xffffffff;
  if ((int)uVar5 < 1) {
    uVar7 = uVar14;
  }
  piVar9 = &pRVar1->renderDataSize;
  for (; uVar7 != uVar14; uVar14 = uVar14 + 1) {
    fVar17 = (float)*piVar9 * theilSenFitting.coefficient + theilSenFitting.offset;
    fVar22 = 0.0;
    if (1.0 <= fVar17) {
      uVar5 = values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[uVar14];
      if ((long)uVar5 < 0) {
        in_R9 = uVar5 >> 1;
      }
      fVar22 = ((float)uVar5 - fVar17) / fVar17;
    }
    *(float *)(CONCAT44(processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start._4_4_,
                        processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start._0_4_) + uVar14 * 4) = fVar22;
    piVar9 = piVar9 + 0x12;
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (CONCAT44(processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start._4_4_,
                      processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start._0_4_),
             CONCAT44(processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_finish._4_4_,
                      processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_finish._0_4_));
  resultStats.maxRelDiffTime =
       *(float *)(CONCAT44(processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl
                           .super__Vector_impl_data._M_finish._4_4_,
                           processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl
                           .super__Vector_impl_data._M_finish._0_4_) + -4);
  resultStats.max9DecileRelDiffTime =
       linearSample<float>((vector<float,_std::allocator<float>_> *)
                           &processingRates.super__Vector_base<float,_std::allocator<float>_>,0.9);
  resultStats.medianRelDiffTime =
       linearSample<float>((vector<float,_std::allocator<float>_> *)
                           &processingRates.super__Vector_base<float,_std::allocator<float>_>,0.5);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&processingRates.super__Vector_base<float,_std::allocator<float>_>);
  std::
  __sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start,
             values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish);
  uVar7 = *values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = uVar7;
  if ((long)uVar7 < 0) {
    uVar5 = (ulong)((uint)uVar7 & 1) | uVar7 >> 1;
  }
  resultStats.result.minTime = (float)uVar7;
  uVar7 = values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish[-1];
  if ((long)uVar7 < 0) {
    uVar5 = uVar7 >> 1;
  }
  resultStats.result.maxTime = (float)uVar7;
  resultStats.result.medianTime =
       linearSample<unsigned_long>
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                  &values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>,0.5);
  resultStats.result.min2DecileTime =
       linearSample<unsigned_long>
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                  &values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>,0.1);
  resultStats.result.max9DecileTime =
       linearSample<unsigned_long>
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                  &values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>,0.9);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  Performance::(anonymous_namespace)::
  calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>>
            (&resultStats.firstRender,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
              *)0x0,uVar5);
  Performance::(anonymous_namespace)::
  calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>>
            (&resultStats.upload,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
              *)0x8,uVar5);
  Performance::(anonymous_namespace)::
  calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>>
            (&resultStats.secondRender,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
              *)0x10,uVar5);
  Performance::(anonymous_namespace)::
  calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>>
            (&resultStats.read,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
              *)0x18,uVar5);
  Performance::(anonymous_namespace)::
  calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>>
            (&resultStats.total,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
              *)0x20,uVar5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&values,"Samples",(allocator<char> *)&local_858);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&processingRates,"Samples",(allocator<char> *)&local_7f0);
  psVar10 = (string *)&processingRates;
  tcu::ScopedLogSection::ScopedLogSection(&section,log,(string *)&values,psVar10);
  std::__cxx11::string::~string((string *)&processingRates);
  std::__cxx11::string::~string((string *)&values);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_788,"Samples",(allocator<char> *)&local_130);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&contributionFitting,"Samples",(allocator<char> *)&local_150);
  tcu::LogSampleList::LogSampleList
            ((LogSampleList *)&local_720,&local_788.m_name,(string *)&contributionFitting);
  __fd = (int)log;
  tcu::LogSampleList::write((LogSampleList *)&local_720,__fd,__buf,(size_t)psVar10);
  tcu::TestLog::startSampleInfo(log);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&section_1,"DataSize",(allocator<char> *)&local_170);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_898,"Data processed",(allocator<char> *)&local_190);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8b8,"bytes",(allocator<char> *)&section_2);
  psVar10 = &local_8b8;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&values,(string *)&section_1,&local_898,psVar10,
             QP_SAMPLE_VALUE_TAG_PREDICTOR);
  tcu::LogValueInfo::write((LogValueInfo *)&values,__fd,__buf_00,(size_t)psVar10);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8d8,"UploadSize",&local_af9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8f8,"Data uploaded",&local_afa);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_918,"bytes",&local_afb);
  psVar10 = &local_918;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&processingRates,&local_8d8,&local_8f8,psVar10,
             QP_SAMPLE_VALUE_TAG_PREDICTOR);
  tcu::LogValueInfo::write((LogValueInfo *)&processingRates,__fd,__buf_01,(size_t)psVar10);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_938,"VertexCount",&local_afc);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_958,"Number of vertices",&local_afd);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_978,"vertices",&local_afe);
  psVar10 = &local_978;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_858,&local_938,&local_958,psVar10,QP_SAMPLE_VALUE_TAG_PREDICTOR)
  ;
  tcu::LogValueInfo::write((LogValueInfo *)&local_858,__fd,__buf_02,(size_t)psVar10);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_998,"DrawReadTime",&local_aff)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,"Second draw call and ReadPixels time",&local_b00);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"us",&local_b01);
  psVar10 = &local_1f0;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_7f0,&local_998,&local_1d0,psVar10,QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::LogValueInfo::write((LogValueInfo *)&local_7f0,__fd,__buf_03,(size_t)psVar10);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_210,"TotalTime",&local_b02);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_230,"Total time",&local_b03);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,"us",&local_b04);
  psVar10 = &local_250;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_4b0,&local_210,&local_230,psVar10,QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::LogValueInfo::write((LogValueInfo *)&local_4b0,__fd,__buf_04,(size_t)psVar10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,"FirstDrawCallTime",&local_b05);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_290,"First draw call time",&local_b06);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b0,"us",&local_b07);
  psVar10 = &local_2b0;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_518,&local_270,&local_290,psVar10,QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::LogValueInfo::write((LogValueInfo *)&local_518,__fd,__buf_05,(size_t)psVar10);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d0,"Upload time",&local_b08);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f0,"Upload time",&local_b09);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,"us",&local_b0a);
  psVar10 = &local_310;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_580,&local_2d0,&local_2f0,psVar10,QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::LogValueInfo::write((LogValueInfo *)&local_580,__fd,__buf_06,(size_t)psVar10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_330,"SecondDrawCallTime",&local_b0b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_350,"Second draw call time",&local_b0c);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_370,"us",&local_b0d);
  psVar10 = &local_370;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_5e8,&local_330,&local_350,psVar10,QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::LogValueInfo::write((LogValueInfo *)&local_5e8,__fd,__buf_07,(size_t)psVar10);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_390,"ReadTime",&local_b0e);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3b0,"ReadPixels time",&local_b0f);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d0,"us",&local_b10);
  psVar10 = &local_3d0;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_650,&local_390,&local_3b0,psVar10,QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::LogValueInfo::write((LogValueInfo *)&local_650,__fd,__buf_08,(size_t)psVar10);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f0,"FitResidual",&local_b11);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_410,"Fit residual",&local_b12)
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_430,"us",&local_b13);
  psVar10 = &local_430;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_6b8,&local_3f0,&local_410,psVar10,QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::LogValueInfo::write((LogValueInfo *)&local_6b8,__fd,__buf_09,(size_t)psVar10);
  tcu::TestLog::endSampleInfo(log);
  tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&local_6b8);
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::~string((string *)&local_3f0);
  tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&local_650);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__cxx11::string::~string((string *)&local_390);
  tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&local_5e8);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::~string((string *)&local_330);
  tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&local_580);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_2d0);
  tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&local_518);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_270);
  tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&local_4b0);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_210);
  tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&local_7f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_998);
  tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&local_858);
  std::__cxx11::string::~string((string *)&local_978);
  std::__cxx11::string::~string((string *)&local_958);
  std::__cxx11::string::~string((string *)&local_938);
  tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&processingRates);
  std::__cxx11::string::~string((string *)&local_918);
  std::__cxx11::string::~string((string *)&local_8f8);
  std::__cxx11::string::~string((string *)&local_8d8);
  tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&values);
  std::__cxx11::string::~string((string *)&local_8b8);
  std::__cxx11::string::~string((string *)&local_898);
  std::__cxx11::string::~string((string *)&section_1);
  tcu::LogSampleList::~LogSampleList((LogSampleList *)&local_720);
  std::__cxx11::string::~string((string *)&contributionFitting);
  std::__cxx11::string::~string((string *)&local_788);
  lVar13 = 0;
  lVar12 = 0;
  while( true ) {
    pRVar1 = (samples->
             super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((int)(((long)(samples->
                     super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pRVar1) / 0x48) <= lVar12)
    break;
    local_af8 = (float)*(ulong *)((long)&(pRVar1->duration).fitResponseDuration + lVar13);
    fVar17 = (float)*(int *)((long)&pRVar1->renderDataSize + lVar13) * theilSenFitting.coefficient +
             theilSenFitting.offset;
    values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._8_16_ = ZEXT416(0);
    values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)log;
    pSVar6 = tcu::SampleBuilder::operator<<
                       ((SampleBuilder *)&values,*(int *)((long)&pRVar1->renderDataSize + lVar13));
    pSVar6 = tcu::SampleBuilder::operator<<
                       (pSVar6,*(int *)((long)&((samples->
                                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                                                )._M_impl.super__Vector_impl_data._M_start)->
                                               uploadedDataSize + lVar13));
    pSVar6 = tcu::SampleBuilder::operator<<
                       (pSVar6,*(int *)((long)&((samples->
                                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                                                )._M_impl.super__Vector_impl_data._M_start)->
                                               numVertices + lVar13));
    pSVar6 = tcu::SampleBuilder::operator<<
                       (pSVar6,*(int *)((long)&(((samples->
                                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->
                                               duration).renderReadDuration + lVar13));
    pSVar6 = tcu::SampleBuilder::operator<<
                       (pSVar6,*(int *)((long)&(((samples->
                                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->
                                               duration).totalDuration + lVar13));
    pSVar6 = tcu::SampleBuilder::operator<<
                       (pSVar6,*(int *)((long)&(((samples->
                                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->
                                               duration).firstRenderDuration + lVar13));
    pSVar6 = tcu::SampleBuilder::operator<<
                       (pSVar6,*(int *)((long)&(((samples->
                                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->
                                               duration).uploadDuration + lVar13));
    pSVar6 = tcu::SampleBuilder::operator<<
                       (pSVar6,*(int *)((long)&(((samples->
                                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->
                                               duration).secondRenderDuration + lVar13));
    pSVar6 = tcu::SampleBuilder::operator<<
                       (pSVar6,*(int *)((long)&(((samples->
                                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->
                                               duration).readDuration + lVar13));
    pSVar6 = tcu::SampleBuilder::operator<<(pSVar6,local_af8 - fVar17);
    tcu::SampleBuilder::operator<<(pSVar6,(EndSampleToken *)&tcu::TestLog::EndSample);
    std::_Vector_base<tcu::SampleBuilder::Value,_std::allocator<tcu::SampleBuilder::Value>_>::
    ~_Vector_base((_Vector_base<tcu::SampleBuilder::Value,_std::allocator<tcu::SampleBuilder::Value>_>
                   *)&values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish);
    lVar12 = lVar12 + 1;
    lVar13 = lVar13 + 0x48;
  }
  tcu::TestLog::endSampleList(log);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&values,"Contribution",(allocator<char> *)&local_858);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&processingRates,"Contributions",(allocator<char> *)&local_7f0);
  psVar10 = (string *)&processingRates;
  tcu::ScopedLogSection::ScopedLogSection(&section_1,log,(string *)&values,psVar10);
  std::__cxx11::string::~string((string *)&processingRates);
  std::__cxx11::string::~string((string *)&values);
  Performance::(anonymous_namespace)::
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>>
            (&contributionFitting,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
              *)0x0,(offset_in_SampleType_to_deUint64)psVar10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7f0,"FirstDrawCallConstantCost",(allocator<char> *)&local_898);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4b0,"First DrawCall: Approximated contant cost",
             (allocator<char> *)&local_8b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_518,"us",(allocator<char> *)&local_8d8);
  pLVar11 = &local_518;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)&values,&local_7f0.m_name,&local_4b0.m_name,&pLVar11->m_name,
             QP_KEY_TAG_TIME,contributionFitting.offset);
  tcu::LogNumber<float>::write((LogNumber<float> *)&values,__fd,__buf_10,(size_t)pLVar11);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_580,"FirstDrawCallLinearCost",(allocator<char> *)&local_8f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5e8,"First DrawCall: Approximated linear cost",
             (allocator<char> *)&local_918);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_650,"us / MB",(allocator<char> *)&local_938);
  pLVar11 = &local_650;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)&processingRates,&local_580.m_name,&local_5e8.m_name,
             &pLVar11->m_name,QP_KEY_TAG_TIME,contributionFitting.coefficient * 1024.0 * 1024.0);
  tcu::LogNumber<float>::write((LogNumber<float> *)&processingRates,__fd,__buf_11,(size_t)pLVar11);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6b8,"FirstDrawCallMedianCost",(allocator<char> *)&local_958);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_720,"First DrawCall: Median cost",(allocator<char> *)&local_978);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_788,"us",(allocator<char> *)&local_998);
  pLVar11 = &local_788;
  tcu::LogNumber<float>::LogNumber
            (&local_858,&local_6b8.m_name,&local_720.m_name,&pLVar11->m_name,QP_KEY_TAG_TIME,
             resultStats.firstRender.medianTime);
  tcu::LogNumber<float>::write(&local_858,__fd,__buf_12,(size_t)pLVar11);
  tcu::LogNumber<float>::~LogNumber(&local_858);
  std::__cxx11::string::~string((string *)&local_788);
  std::__cxx11::string::~string((string *)&local_720);
  std::__cxx11::string::~string((string *)&local_6b8);
  tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&processingRates);
  std::__cxx11::string::~string((string *)&local_650);
  std::__cxx11::string::~string((string *)&local_5e8);
  std::__cxx11::string::~string((string *)&local_580);
  tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&values);
  std::__cxx11::string::~string((string *)&local_518);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::__cxx11::string::~string((string *)&local_7f0);
  Performance::(anonymous_namespace)::
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>>
            (&contributionFitting,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
              *)0x8,(offset_in_SampleType_to_deUint64)pLVar11);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7f0,"UploadConstantCost",(allocator<char> *)&local_898);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4b0,"Upload: Approximated contant cost",(allocator<char> *)&local_8b8)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_518,"us",(allocator<char> *)&local_8d8);
  pLVar11 = &local_518;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)&values,&local_7f0.m_name,&local_4b0.m_name,&pLVar11->m_name,
             QP_KEY_TAG_TIME,contributionFitting.offset);
  tcu::LogNumber<float>::write((LogNumber<float> *)&values,__fd,__buf_13,(size_t)pLVar11);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_580,"UploadLinearCost",(allocator<char> *)&local_8f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5e8,"Upload: Approximated linear cost",(allocator<char> *)&local_918);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_650,"us / MB",(allocator<char> *)&local_938);
  pLVar11 = &local_650;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)&processingRates,&local_580.m_name,&local_5e8.m_name,
             &pLVar11->m_name,QP_KEY_TAG_TIME,contributionFitting.coefficient * 1024.0 * 1024.0);
  tcu::LogNumber<float>::write((LogNumber<float> *)&processingRates,__fd,__buf_14,(size_t)pLVar11);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6b8,"UploadMedianCost",(allocator<char> *)&local_958);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_720,"Upload: Median cost",(allocator<char> *)&local_978);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_788,"us",(allocator<char> *)&local_998);
  pLVar11 = &local_788;
  tcu::LogNumber<float>::LogNumber
            (&local_858,&local_6b8.m_name,&local_720.m_name,&pLVar11->m_name,QP_KEY_TAG_TIME,
             resultStats.upload.medianTime);
  tcu::LogNumber<float>::write(&local_858,__fd,__buf_15,(size_t)pLVar11);
  tcu::LogNumber<float>::~LogNumber(&local_858);
  std::__cxx11::string::~string((string *)&local_788);
  std::__cxx11::string::~string((string *)&local_720);
  std::__cxx11::string::~string((string *)&local_6b8);
  tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&processingRates);
  std::__cxx11::string::~string((string *)&local_650);
  std::__cxx11::string::~string((string *)&local_5e8);
  std::__cxx11::string::~string((string *)&local_580);
  tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&values);
  std::__cxx11::string::~string((string *)&local_518);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::__cxx11::string::~string((string *)&local_7f0);
  Performance::(anonymous_namespace)::
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>>
            (&contributionFitting,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
              *)0x10,(offset_in_SampleType_to_deUint64)pLVar11);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7f0,"SecondDrawCallConstantCost",(allocator<char> *)&local_898);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4b0,"Second DrawCall: Approximated contant cost",
             (allocator<char> *)&local_8b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_518,"us",(allocator<char> *)&local_8d8);
  pLVar11 = &local_518;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)&values,&local_7f0.m_name,&local_4b0.m_name,&pLVar11->m_name,
             QP_KEY_TAG_TIME,contributionFitting.offset);
  tcu::LogNumber<float>::write((LogNumber<float> *)&values,__fd,__buf_16,(size_t)pLVar11);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_580,"SecondDrawCallLinearCost",(allocator<char> *)&local_8f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5e8,"Second DrawCall: Approximated linear cost",
             (allocator<char> *)&local_918);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_650,"us / MB",(allocator<char> *)&local_938);
  pLVar11 = &local_650;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)&processingRates,&local_580.m_name,&local_5e8.m_name,
             &pLVar11->m_name,QP_KEY_TAG_TIME,contributionFitting.coefficient * 1024.0 * 1024.0);
  tcu::LogNumber<float>::write((LogNumber<float> *)&processingRates,__fd,__buf_17,(size_t)pLVar11);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6b8,"SecondDrawCallMedianCost",(allocator<char> *)&local_958);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_720,"Second DrawCall: Median cost",(allocator<char> *)&local_978);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_788,"us",(allocator<char> *)&local_998);
  pLVar11 = &local_788;
  tcu::LogNumber<float>::LogNumber
            (&local_858,&local_6b8.m_name,&local_720.m_name,&pLVar11->m_name,QP_KEY_TAG_TIME,
             resultStats.secondRender.medianTime);
  tcu::LogNumber<float>::write(&local_858,__fd,__buf_18,(size_t)pLVar11);
  tcu::LogNumber<float>::~LogNumber(&local_858);
  std::__cxx11::string::~string((string *)&local_788);
  std::__cxx11::string::~string((string *)&local_720);
  std::__cxx11::string::~string((string *)&local_6b8);
  tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&processingRates);
  std::__cxx11::string::~string((string *)&local_650);
  std::__cxx11::string::~string((string *)&local_5e8);
  std::__cxx11::string::~string((string *)&local_580);
  tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&values);
  std::__cxx11::string::~string((string *)&local_518);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::__cxx11::string::~string((string *)&local_7f0);
  Performance::(anonymous_namespace)::
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>>
            (&contributionFitting,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
              *)0x18,(offset_in_SampleType_to_deUint64)pLVar11);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7f0,"ReadConstantCost",(allocator<char> *)&local_898);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4b0,"Read: Approximated contant cost",(allocator<char> *)&local_8b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_518,"us",(allocator<char> *)&local_8d8);
  pLVar11 = &local_518;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)&values,&local_7f0.m_name,&local_4b0.m_name,&pLVar11->m_name,
             QP_KEY_TAG_TIME,contributionFitting.offset);
  tcu::LogNumber<float>::write((LogNumber<float> *)&values,__fd,__buf_19,(size_t)pLVar11);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_580,"ReadLinearCost",(allocator<char> *)&local_8f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5e8,"Read: Approximated linear cost",(allocator<char> *)&local_918);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_650,"us / MB",(allocator<char> *)&local_938);
  pLVar11 = &local_650;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)&processingRates,&local_580.m_name,&local_5e8.m_name,
             &pLVar11->m_name,QP_KEY_TAG_TIME,contributionFitting.coefficient * 1024.0 * 1024.0);
  tcu::LogNumber<float>::write((LogNumber<float> *)&processingRates,__fd,__buf_20,(size_t)pLVar11);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6b8,"ReadMedianCost",(allocator<char> *)&local_958);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_720,"Read: Median cost",(allocator<char> *)&local_978);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_788,"us",(allocator<char> *)&local_998);
  pLVar11 = &local_788;
  tcu::LogNumber<float>::LogNumber
            (&local_858,&local_6b8.m_name,&local_720.m_name,&pLVar11->m_name,QP_KEY_TAG_TIME,
             resultStats.read.medianTime);
  tcu::LogNumber<float>::write(&local_858,__fd,__buf_21,(size_t)pLVar11);
  tcu::LogNumber<float>::~LogNumber(&local_858);
  std::__cxx11::string::~string((string *)&local_788);
  std::__cxx11::string::~string((string *)&local_720);
  std::__cxx11::string::~string((string *)&local_6b8);
  tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&processingRates);
  std::__cxx11::string::~string((string *)&local_650);
  std::__cxx11::string::~string((string *)&local_5e8);
  std::__cxx11::string::~string((string *)&local_580);
  tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&values);
  std::__cxx11::string::~string((string *)&local_518);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::__cxx11::string::~string((string *)&local_7f0);
  Performance::(anonymous_namespace)::
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>>
            (&contributionFitting,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
              *)0x20,(offset_in_SampleType_to_deUint64)pLVar11);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7f0,"TotalConstantCost",(allocator<char> *)&local_898);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4b0,"Total: Approximated contant cost",(allocator<char> *)&local_8b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_518,"us",(allocator<char> *)&local_8d8);
  pLVar11 = &local_518;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)&values,&local_7f0.m_name,&local_4b0.m_name,&pLVar11->m_name,
             QP_KEY_TAG_TIME,contributionFitting.offset);
  tcu::LogNumber<float>::write((LogNumber<float> *)&values,__fd,__buf_22,(size_t)pLVar11);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_580,"TotalLinearCost",(allocator<char> *)&local_8f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5e8,"Total: Approximated linear cost",(allocator<char> *)&local_918);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_650,"us / MB",(allocator<char> *)&local_938);
  pLVar11 = &local_650;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)&processingRates,&local_580.m_name,&local_5e8.m_name,
             &pLVar11->m_name,QP_KEY_TAG_TIME,contributionFitting.coefficient * 1024.0 * 1024.0);
  tcu::LogNumber<float>::write((LogNumber<float> *)&processingRates,__fd,__buf_23,(size_t)pLVar11);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6b8,"TotalMedianCost",(allocator<char> *)&local_958);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_720,"Total: Median cost",(allocator<char> *)&local_978);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_788,"us",(allocator<char> *)&local_998);
  pLVar11 = &local_788;
  tcu::LogNumber<float>::LogNumber
            (&local_858,&local_6b8.m_name,&local_720.m_name,&pLVar11->m_name,QP_KEY_TAG_TIME,
             resultStats.total.medianTime);
  tcu::LogNumber<float>::write(&local_858,__fd,__buf_24,(size_t)pLVar11);
  tcu::LogNumber<float>::~LogNumber(&local_858);
  std::__cxx11::string::~string((string *)&local_788);
  std::__cxx11::string::~string((string *)&local_720);
  std::__cxx11::string::~string((string *)&local_6b8);
  tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&processingRates);
  std::__cxx11::string::~string((string *)&local_650);
  std::__cxx11::string::~string((string *)&local_5e8);
  std::__cxx11::string::~string((string *)&local_580);
  tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&values);
  std::__cxx11::string::~string((string *)&local_518);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::__cxx11::string::~string((string *)&local_7f0);
  tcu::ScopedLogSection::~ScopedLogSection(&section_1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&values,"Results",(allocator<char> *)&local_858);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&processingRates,"Results",(allocator<char> *)&local_7f0);
  tcu::ScopedLogSection::ScopedLogSection
            (&section_2,log,(string *)&values,(string *)&processingRates);
  std::__cxx11::string::~string((string *)&processingRates);
  std::__cxx11::string::~string((string *)&values);
  pRVar1 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pRVar2 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_af8 = (float)((pRVar2[-1].renderDataSize + pRVar1->renderDataSize) / 2);
  fVar23 = theilSenFitting.coefficient * local_af8;
  fVar18 = theilSenFitting.offset + fVar23;
  uVar7 = ((long)pRVar2 - (long)pRVar1) / 0x48;
  uVar7 = (long)((ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | uVar7 & 0xffffffff) / 2;
  Performance::(anonymous_namespace)::
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>>
            ((LineParametersWithConfidence *)&values,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
              *)0x0,(int)uVar7,0x30,in_R9);
  Performance::(anonymous_namespace)::
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>>
            ((LineParametersWithConfidence *)&processingRates,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
              *)(uVar7 & 0xffffffff),
             (int)(((long)(samples->
                          super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(samples->
                         super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                         )._M_impl.super__Vector_impl_data._M_start) / 0x48),0x30,in_R9);
  fVar22 = processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish._4_4_;
  fVar17 = processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start._0_4_;
  pRVar1 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pRVar2 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_448._0_4_ = (undefined4)pRVar1->renderDataSize;
  fVar25 = values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start._0_4_;
  fVar3 = values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish._4_4_;
  xmax = (float)pRVar2[-1].renderDataSize;
  fVar19 = getAreaBetweenLines((float)local_448._0_4_,xmax,
                               values.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_4_,
                               values.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish._4_4_,
                               processingRates.super__Vector_base<float,_std::allocator<float>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_4_,
                               processingRates.super__Vector_base<float,_std::allocator<float>_>.
                               _M_impl.super__Vector_impl_data._M_finish._4_4_);
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
            ((LineParametersWithConfidence *)&values,samples,0,
             (int)(((long)pRVar2 - (long)pRVar1) / 0x48),2,0x30);
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
            ((LineParametersWithConfidence *)&processingRates,samples,1,
             (int)(((long)(samples->
                          super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(samples->
                         super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                         )._M_impl.super__Vector_impl_data._M_start) / 0x48),2,0x30);
  xmin = (float)((samples->
                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                 )._M_impl.super__Vector_impl_data._M_start)->renderDataSize;
  fVar26 = values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start._0_4_;
  fVar4 = values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish._4_4_;
  xmax_00 = (float)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish[-1].renderDataSize;
  fVar20 = getAreaBetweenLines(xmin,xmax_00,
                               values.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_4_,
                               values.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish._4_4_,
                               processingRates.super__Vector_base<float,_std::allocator<float>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_4_,
                               processingRates.super__Vector_base<float,_std::allocator<float>_>.
                               _M_impl.super__Vector_impl_data._M_finish._4_4_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&contributionFitting,"ResultLinearity",&local_af9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&section_1,"Sample linearity",&local_afa);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_898,"%",&local_afb);
  fVar21 = fVar3 * (float)local_448._0_4_ + fVar25;
  fVar24 = fVar22 * (float)local_448._0_4_ + fVar17;
  uVar15 = -(uint)(fVar21 <= fVar24);
  fVar25 = fVar3 * xmax + fVar25;
  fVar17 = fVar22 * xmax + fVar17;
  uVar16 = -(uint)(fVar17 <= fVar25);
  fVar17 = ((float)(~uVar16 & (uint)fVar17 | (uint)fVar25 & uVar16) -
           (float)(~uVar15 & (uint)fVar24 | (uint)fVar21 & uVar15)) *
           (xmax - (float)local_448._0_4_);
  fVar22 = (float)(~-(uint)(fVar17 < 1e-06) & (uint)(1.0 - fVar19 / fVar17));
  fVar17 = 1.0;
  if (fVar22 <= 1.0) {
    fVar17 = fVar22;
  }
  psVar10 = &local_898;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)&values,(string *)&contributionFitting,(string *)&section_1,psVar10
             ,QP_KEY_TAG_QUALITY,(float)(~-(uint)(fVar22 < 0.0) & (uint)(fVar17 * 100.0)));
  tcu::LogNumber<float>::write((LogNumber<float> *)&values,__fd,__buf_25,(size_t)psVar10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8b8,"SampleTemporalStability",&local_afc);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8d8,"Sample temporal stability",&local_afd);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8f8,"%",&local_afe);
  fVar17 = fVar4 * xmin + fVar26;
  fVar22 = processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish._4_4_ * xmin +
           processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start._0_4_;
  uVar15 = -(uint)(fVar17 <= fVar22);
  fVar26 = fVar4 * xmax_00 + fVar26;
  fVar25 = processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish._4_4_ * xmax_00 +
           processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start._0_4_;
  uVar16 = -(uint)(fVar25 <= fVar26);
  fVar17 = ((float)(~uVar16 & (uint)fVar25 | (uint)fVar26 & uVar16) -
           (float)(~uVar15 & (uint)fVar22 | (uint)fVar17 & uVar15)) * (xmax_00 - xmin);
  fVar22 = (float)(~-(uint)(fVar17 < 1e-06) & (uint)(1.0 - fVar20 / fVar17));
  fVar17 = 1.0;
  if (fVar22 <= 1.0) {
    fVar17 = fVar22;
  }
  psVar10 = &local_8f8;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)&processingRates,&local_8b8,&local_8d8,psVar10,QP_KEY_TAG_QUALITY,
             (float)(~-(uint)(fVar22 < 0.0) & (uint)(fVar17 * 100.0)));
  tcu::LogNumber<float>::write((LogNumber<float> *)&processingRates,__fd,__buf_26,(size_t)psVar10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_918,"ApproximatedConstantCost",&local_aff);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_938,"Approximated contant cost",&local_b00);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_958,"us",&local_b01);
  psVar10 = &local_958;
  tcu::LogNumber<float>::LogNumber
            (&local_858,&local_918,&local_938,psVar10,QP_KEY_TAG_TIME,theilSenFitting.offset);
  tcu::LogNumber<float>::write(&local_858,__fd,__buf_27,(size_t)psVar10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_978,"ApproximatedConstantCostConfidence60Lower",&local_b02);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_998,"Approximated contant cost 60% confidence lower limit",&local_b03)
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"us",&local_b04);
  psVar10 = &local_1d0;
  tcu::LogNumber<float>::LogNumber
            (&local_7f0,&local_978,&local_998,psVar10,QP_KEY_TAG_TIME,
             theilSenFitting.offsetConfidenceLower);
  tcu::LogNumber<float>::write(&local_7f0,__fd,__buf_28,(size_t)psVar10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0,"ApproximatedConstantCostConfidence60Upper",&local_b05);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,"Approximated contant cost 60% confidence upper limit",&local_b06)
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_230,"us",&local_b07);
  psVar10 = &local_230;
  tcu::LogNumber<float>::LogNumber
            (&local_4b0,&local_1f0,&local_210,psVar10,QP_KEY_TAG_TIME,
             theilSenFitting.offsetConfidenceUpper);
  tcu::LogNumber<float>::write(&local_4b0,__fd,__buf_29,(size_t)psVar10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_250,"ApproximatedLinearCost",&local_b08);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,"Approximated linear cost",&local_b09);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_290,"us / MB",&local_b0a);
  psVar10 = &local_290;
  tcu::LogNumber<float>::LogNumber
            (&local_518,&local_250,&local_270,psVar10,QP_KEY_TAG_TIME,
             theilSenFitting.coefficient * 1024.0 * 1024.0);
  tcu::LogNumber<float>::write(&local_518,__fd,__buf_30,(size_t)psVar10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b0,"ApproximatedLinearCostConfidence60Lower",&local_b0b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2d0,"Approximated linear cost 60% confidence lower limit",&local_b0c);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f0,"us / MB",&local_b0d);
  psVar10 = &local_2f0;
  tcu::LogNumber<float>::LogNumber
            (&local_580,&local_2b0,&local_2d0,psVar10,QP_KEY_TAG_TIME,
             theilSenFitting.coefficientConfidenceLower * 1024.0 * 1024.0);
  tcu::LogNumber<float>::write(&local_580,__fd,__buf_31,(size_t)psVar10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_310,"ApproximatedLinearCostConfidence60Upper",&local_b0e);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_330,"Approximated linear cost 60% confidence upper limit",&local_b0f);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_350,"us / MB",&local_b10);
  psVar10 = &local_350;
  tcu::LogNumber<float>::LogNumber
            (&local_5e8,&local_310,&local_330,psVar10,QP_KEY_TAG_TIME,
             theilSenFitting.coefficientConfidenceUpper * 1024.0 * 1024.0);
  tcu::LogNumber<float>::write(&local_5e8,__fd,__buf_32,(size_t)psVar10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_370,"ApproximatedProcessRate",&local_b11);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_390,"Approximated processing rate",&local_b12);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b0,"MB / s",&local_b13);
  fVar17 = local_af8 / ((fVar18 / 1000.0) / 1000.0);
  local_448 = ZEXT416((uint)fVar17);
  psVar10 = &local_3b0;
  tcu::LogNumber<float>::LogNumber
            (&local_650,&local_370,&local_390,psVar10,QP_KEY_TAG_PERFORMANCE,
             fVar17 * 0.0009765625 * 0.0009765625);
  tcu::LogNumber<float>::write(&local_650,__fd,__buf_33,(size_t)psVar10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3d0,"ApproximatedProcessRateNoConstant",&local_ae9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3f0,"Approximated processing rate without constant cost",&local_aea);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_410,"MB / s",&local_aeb);
  psVar10 = &local_410;
  tcu::LogNumber<float>::LogNumber
            (&local_6b8,&local_3d0,&local_3f0,psVar10,QP_KEY_TAG_PERFORMANCE,
             (local_af8 / ((fVar23 / 1000.0) / 1000.0)) * 0.0009765625 * 0.0009765625);
  tcu::LogNumber<float>::write(&local_6b8,__fd,__buf_34,(size_t)psVar10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_430,"SampleMedianTime",&local_aec);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&section,"Median sample time",&local_aed);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"us",&local_aee);
  psVar10 = &local_130;
  tcu::LogNumber<float>::LogNumber
            (&local_720,&local_430,(string *)&section,psVar10,QP_KEY_TAG_TIME,
             resultStats.result.medianTime);
  tcu::LogNumber<float>::write(&local_720,__fd,__buf_35,(size_t)psVar10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_150,"SampleMedianProcess",&local_aef);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170,"Median processing rate",&local_af0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,"MB / s",&local_af1);
  psVar10 = &local_190;
  tcu::LogNumber<float>::LogNumber
            (&local_788,&local_150,&local_170,psVar10,QP_KEY_TAG_PERFORMANCE,
             resultStats.medianRate * 0.0009765625 * 0.0009765625);
  tcu::LogNumber<float>::write(&local_788,__fd,__buf_36,(size_t)psVar10);
  tcu::LogNumber<float>::~LogNumber(&local_788);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_150);
  tcu::LogNumber<float>::~LogNumber(&local_720);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&section);
  std::__cxx11::string::~string((string *)&local_430);
  tcu::LogNumber<float>::~LogNumber(&local_6b8);
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::~string((string *)&local_3d0);
  tcu::LogNumber<float>::~LogNumber(&local_650);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__cxx11::string::~string((string *)&local_390);
  std::__cxx11::string::~string((string *)&local_370);
  tcu::LogNumber<float>::~LogNumber(&local_5e8);
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)&local_310);
  tcu::LogNumber<float>::~LogNumber(&local_580);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2b0);
  tcu::LogNumber<float>::~LogNumber(&local_518);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_250);
  tcu::LogNumber<float>::~LogNumber(&local_4b0);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  tcu::LogNumber<float>::~LogNumber(&local_7f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_998);
  std::__cxx11::string::~string((string *)&local_978);
  tcu::LogNumber<float>::~LogNumber(&local_858);
  std::__cxx11::string::~string((string *)&local_958);
  std::__cxx11::string::~string((string *)&local_938);
  std::__cxx11::string::~string((string *)&local_918);
  tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&processingRates);
  std::__cxx11::string::~string((string *)&local_8f8);
  std::__cxx11::string::~string((string *)&local_8d8);
  std::__cxx11::string::~string((string *)&local_8b8);
  tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&values);
  std::__cxx11::string::~string((string *)&local_898);
  std::__cxx11::string::~string((string *)&section_1);
  std::__cxx11::string::~string((string *)&contributionFitting);
  tcu::ScopedLogSection::~ScopedLogSection(&section_2);
  RVar27.renderRateAtRange = (float)local_448._0_4_;
  RVar27.renderRateMedian = resultStats.medianRate;
  RVar27.renderRateAtInfinity = resultStats.medianRate;
  return RVar27;
}

Assistant:

static RenderSampleAnalyzeResult analyzeSampleResults (tcu::TestLog& log, const std::vector<RenderSampleResult<SampleType> >& samples)
{
	// Assume data is linear with some outliers, fit a line
	const LineParametersWithConfidence						theilSenFitting						= fitLineToSamples(samples);
	const typename SampleTypeTraits<SampleType>::StatsType	resultStats							= calculateSampleStatistics(theilSenFitting, samples);
	float													approximatedProcessingRate;
	float													approximatedProcessingRateNoConstant;

	// output raw samples
	{
		const tcu::ScopedLogSection	section(log, "Samples", "Samples");
		logSampleList(log, theilSenFitting, samples);
	}

	// Contributions
	if (SampleTypeTraits<SampleType>::LOG_CONTRIBUTIONS)
	{
		const tcu::ScopedLogSection	section(log, "Contribution", "Contributions");

		logFirstRenderContribution(log, samples, resultStats);
		logUploadContribution(log, samples, resultStats);
		logRenderContribution(log, samples, resultStats);
		logSecondRenderContribution(log, samples, resultStats);
		logReadContribution(log, samples, resultStats);
		logTotalContribution(log, samples, resultStats);
	}

	// print results
	{
		const tcu::ScopedLogSection	section(log, "Results", "Results");

		const int	medianDataSize						= (samples.front().renderDataSize + samples.back().renderDataSize) / 2;
		const float	approximatedRenderTime				= (theilSenFitting.offset + theilSenFitting.coefficient * (float)medianDataSize) / 1000.0f / 1000.0f;
		const float	approximatedRenderTimeNoConstant	= (theilSenFitting.coefficient * (float)medianDataSize) / 1000.0f / 1000.0f;
		const float	sampleLinearity						= calculateSampleFitLinearity(samples);
		const float	sampleTemporalStability				= calculateSampleTemporalStability(samples);

		approximatedProcessingRateNoConstant			= (float)medianDataSize / approximatedRenderTimeNoConstant;
		approximatedProcessingRate						= (float)medianDataSize / approximatedRenderTime;

		log	<< tcu::TestLog::Float("ResultLinearity", "Sample linearity", "%", QP_KEY_TAG_QUALITY, sampleLinearity * 100.0f)
			<< tcu::TestLog::Float("SampleTemporalStability", "Sample temporal stability", "%", QP_KEY_TAG_QUALITY, sampleTemporalStability * 100.0f)
			<< tcu::TestLog::Float("ApproximatedConstantCost", "Approximated contant cost", "us", QP_KEY_TAG_TIME, theilSenFitting.offset)
			<< tcu::TestLog::Float("ApproximatedConstantCostConfidence60Lower", "Approximated contant cost 60% confidence lower limit", "us", QP_KEY_TAG_TIME, theilSenFitting.offsetConfidenceLower)
			<< tcu::TestLog::Float("ApproximatedConstantCostConfidence60Upper", "Approximated contant cost 60% confidence upper limit", "us", QP_KEY_TAG_TIME, theilSenFitting.offsetConfidenceUpper)
			<< tcu::TestLog::Float("ApproximatedLinearCost", "Approximated linear cost", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficient * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedLinearCostConfidence60Lower", "Approximated linear cost 60% confidence lower limit", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficientConfidenceLower * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedLinearCostConfidence60Upper", "Approximated linear cost 60% confidence upper limit", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficientConfidenceUpper * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedProcessRate", "Approximated processing rate", "MB / s", QP_KEY_TAG_PERFORMANCE, approximatedProcessingRate / 1024.0f / 1024.0f)
			<< tcu::TestLog::Float("ApproximatedProcessRateNoConstant", "Approximated processing rate without constant cost", "MB / s", QP_KEY_TAG_PERFORMANCE, approximatedProcessingRateNoConstant / 1024.0f / 1024.0f)
			<< tcu::TestLog::Float("SampleMedianTime", "Median sample time", "us", QP_KEY_TAG_TIME, resultStats.result.medianTime)
			<< tcu::TestLog::Float("SampleMedianProcess", "Median processing rate", "MB / s", QP_KEY_TAG_PERFORMANCE, resultStats.medianRate / 1024.0f / 1024.0f);
	}

	// return approximated render rate
	{
		RenderSampleAnalyzeResult result;

		result.renderRateMedian		= resultStats.medianRate;
		result.renderRateAtRange	= approximatedProcessingRate;
		result.renderRateAtInfinity = approximatedProcessingRateNoConstant;

		return result;
	}
	return RenderSampleAnalyzeResult();
}